

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_container.cpp
# Opt level: O0

bool __thiscall cppnet::TimerContainer::RmTimer(TimerContainer *this,weak_ptr<cppnet::TimerSlot> *t)

{
  uint16_t uVar1;
  bool bVar2;
  uint16_t uVar3;
  int iVar4;
  element_type *peVar5;
  pointer ppVar6;
  pointer ppVar7;
  element_type *peVar8;
  weak_ptr<cppnet::TimerSlot> local_b0;
  _List_node_base *local_a0;
  const_iterator local_98;
  undefined1 local_90 [8];
  shared_ptr<cppnet::TimerSlot> target;
  _Self local_78;
  iterator timer;
  _Self local_68;
  iterator timer_list;
  uint local_54;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>,_false>
  local_50;
  iterator timer_map;
  uint32_t left_time;
  uint16_t local_38;
  uint16_t local_36;
  uint local_34;
  uint16_t type;
  uint16_t cur_index;
  shared_ptr<cppnet::TimerSlot> ptr;
  weak_ptr<cppnet::TimerSlot> *t_local;
  TimerContainer *this_local;
  
  ptr.super___shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)t;
  std::weak_ptr<cppnet::TimerSlot>::lock((weak_ptr<cppnet::TimerSlot> *)&type);
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&type);
  if (bVar2) {
    local_36 = 0;
    local_38 = 0;
    peVar5 = std::__shared_ptr_access<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&type);
    TimerSlot::GetCurIndex(peVar5,&local_36,&local_38);
    uVar1 = local_38;
    uVar3 = TimeUnit2TimeType(this,this->_time_unit);
    if (uVar1 == uVar3) {
      peVar5 = std::__shared_ptr_access<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&type);
      TimerSlot::RmInTimer(peVar5);
      Bitmap::Remove(&this->_bitmap,(uint)local_36);
      peVar5 = std::__shared_ptr_access<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&type);
      timer_map.
      super__Node_iterator_base<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>,_false>
      ._M_cur._0_4_ = TimerSlot::GetLeftInterval(peVar5);
      local_54 = (uint)local_36;
      local_50._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>_>_>
           ::find(&this->_timer_wheel,&local_54);
      timer_list._M_node =
           (_Base_ptr)
           std::
           unordered_map<unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>_>_>
           ::end(&this->_timer_wheel);
      bVar2 = std::__detail::operator==
                        (&local_50,
                         (_Node_iterator_base<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>,_false>
                          *)&timer_list);
      if (bVar2) {
        this_local._7_1_ = 1;
        local_34 = 1;
      }
      else {
        bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->_sub_timer);
        if (!bVar2) {
          timer_map.
          super__Node_iterator_base<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>,_false>
          ._M_cur._0_4_ = 0;
        }
        ppVar6 = std::__detail::
                 _Node_iterator<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>,_false,_false>
                 ::operator->((_Node_iterator<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>,_false,_false>
                               *)&local_50);
        local_68._M_node =
             (_Base_ptr)
             std::
             map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>
             ::find(&ppVar6->second,(key_type_conflict *)&timer_map);
        ppVar6 = std::__detail::
                 _Node_iterator<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>,_false,_false>
                 ::operator->((_Node_iterator<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>,_false,_false>
                               *)&local_50);
        timer._M_node =
             (_List_node_base *)
             std::
             map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>
             ::end(&ppVar6->second);
        bVar2 = std::operator==(&local_68,(_Self *)&timer);
        if (bVar2) {
          this_local._7_1_ = 0;
          local_34 = 1;
        }
        else {
          ppVar7 = std::
                   _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>
                   ::operator->(&local_68);
          local_78._M_node =
               (_List_node_base *)
               std::__cxx11::
               list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
               ::begin(&ppVar7->second);
          while( true ) {
            ppVar7 = std::
                     _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>
                     ::operator->(&local_68);
            target.super___shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    std::__cxx11::
                    list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
                    ::end(&ppVar7->second);
            bVar2 = std::operator!=(&local_78,
                                    (_Self *)&target.
                                              super___shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount);
            if (!bVar2) break;
            std::_List_iterator<std::weak_ptr<cppnet::TimerSlot>_>::operator->(&local_78);
            std::weak_ptr<cppnet::TimerSlot>::lock((weak_ptr<cppnet::TimerSlot> *)local_90);
            bVar2 = std::operator==((shared_ptr<cppnet::TimerSlot> *)local_90,
                                    (shared_ptr<cppnet::TimerSlot> *)&type);
            if (bVar2) {
              ppVar7 = std::
                       _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>
                       ::operator->(&local_68);
              std::_List_const_iterator<std::weak_ptr<cppnet::TimerSlot>_>::_List_const_iterator
                        (&local_98,&local_78);
              local_a0 = (_List_node_base *)
                         std::__cxx11::
                         list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
                         ::erase(&ppVar7->second,local_98);
              this_local._7_1_ = 1;
            }
            local_34 = (uint)bVar2;
            std::shared_ptr<cppnet::TimerSlot>::~shared_ptr
                      ((shared_ptr<cppnet::TimerSlot> *)local_90);
            if (local_34 != 0) goto LAB_0012fae1;
            std::_List_iterator<std::weak_ptr<cppnet::TimerSlot>_>::operator++(&local_78);
          }
          this_local._7_1_ = 1;
          local_34 = 1;
        }
      }
    }
    else {
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->_sub_timer);
      if (bVar2) {
        peVar8 = std::
                 __shared_ptr_access<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->_sub_timer);
        std::weak_ptr<cppnet::TimerSlot>::weak_ptr(&local_b0,t);
        iVar4 = (*(peVar8->super_Timer)._vptr_Timer[1])(peVar8,&local_b0);
        this_local._7_1_ = (byte)iVar4 & 1;
        std::weak_ptr<cppnet::TimerSlot>::~weak_ptr(&local_b0);
        local_34 = 1;
      }
      else {
        this_local._7_1_ = 0;
        local_34 = 1;
      }
    }
  }
  else {
    this_local._7_1_ = 0;
    local_34 = 1;
  }
LAB_0012fae1:
  std::shared_ptr<cppnet::TimerSlot>::~shared_ptr((shared_ptr<cppnet::TimerSlot> *)&type);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool TimerContainer::RmTimer(std::weak_ptr<TimerSlot> t) {
    auto ptr = t.lock();
    if (!ptr) {
        return false;
    }

    uint16_t cur_index = 0;
    uint16_t type = 0;
    ptr->GetCurIndex(cur_index, type);
    if (type == TimeUnit2TimeType(_time_unit)) {
        ptr->RmInTimer();
        _bitmap.Remove(cur_index);
        uint32_t left_time = ptr->GetLeftInterval();
        auto timer_map = _timer_wheel.find(cur_index);
        if (timer_map == _timer_wheel.end()) {
            return true;
        }
        // don't have sub timer
        if (!_sub_timer) {
            left_time = 0;
        }
        auto timer_list = timer_map->second.find(left_time);
        if (timer_list == timer_map->second.end()) {
            return false;
        }
        for (auto timer = timer_list->second.begin(); timer != timer_list->second.end(); ++timer) {
            auto target = timer->lock();
            if (target == ptr) {
                timer_list->second.erase(timer);
                return true;
            }
        }
        return true;
    }

    if (_sub_timer) {
        return _sub_timer->RmTimer(t);
    }
    return false;
}